

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O3

ssize_t amqp_tcp_socket_writev(void *base,iovec *iov,int iovcnt)

{
  ssize_t sVar1;
  long lVar2;
  ulong uVar3;
  
  if (iovcnt < 2) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(iovcnt - 1);
    lVar2 = 0;
    do {
      sVar1 = amqp_tcp_socket_send_inner
                        (base,*(void **)((long)&iov->iov_base + lVar2),
                         *(size_t *)((long)&iov->iov_len + lVar2),0x8000);
      if (sVar1 != 0) {
        return sVar1;
      }
      lVar2 = lVar2 + 0x10;
    } while (uVar3 << 4 != lVar2);
  }
  sVar1 = amqp_tcp_socket_send_inner(base,iov[uVar3].iov_base,iov[uVar3].iov_len,0);
  return sVar1;
}

Assistant:

static ssize_t
amqp_tcp_socket_writev(void *base, struct iovec *iov, int iovcnt)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t ret;

#if defined(_WIN32)
  DWORD res;
  /* Making the assumption here that WSAsend won't do a partial send
   * unless an error occured, in which case we're hosed so it doesn't matter */
  if (WSASend(self->sockfd, (LPWSABUF)iov, iovcnt, &res, 0, NULL, NULL) == 0) {
    self->internal_error = 0;
    ret = AMQP_STATUS_OK;
  } else {
    self->internal_error = WSAGetLastError();
    ret = AMQP_STATUS_SOCKET_ERROR;
  }
  return ret;

#elif defined(MSG_MORE)
  int i;
  for (i = 0; i < iovcnt - 1; ++i) {
    ret = amqp_tcp_socket_send_inner(self, iov[i].iov_base, iov[i].iov_len, MSG_MORE);
    if (ret != AMQP_STATUS_OK) {
      goto exit;
    }
  }
  ret = amqp_tcp_socket_send_inner(self, iov[i].iov_base, iov[i].iov_len, 0);

exit:
  return ret;

#elif defined(SO_NOSIGPIPE) || !defined(MSG_NOSIGNAL)
  int i;
  ssize_t len_left = 0;


  struct iovec *iov_left = iov;
  int iovcnt_left = iovcnt;

  for (i = 0; i < iovcnt; ++i) {
    len_left += iov[i].iov_len;
  }

start:
  ret = writev(self->sockfd, iov_left, iovcnt_left);

  if (ret < 0) {
    self->internal_error = amqp_os_socket_error();
    if (EINTR == self->internal_error) {
      goto start;
    } else {
      self->internal_error = amqp_os_socket_error();
      ret = AMQP_STATUS_SOCKET_ERROR;
    }
  } else {
    if (ret == len_left) {
      self->internal_error = 0;
      ret = AMQP_STATUS_OK;
    } else {
      len_left -= ret;
      for (i = 0; i < iovcnt_left; ++i) {
        if (ret < (ssize_t)iov_left[i].iov_len) {
          iov_left[i].iov_base = ((char*)iov_left[i].iov_base) + ret;
          iov_left[i].iov_len -= ret;

          iovcnt_left -= i;
          iov_left += i;
          break;
        } else {
          ret -= iov_left[i].iov_len;
        }
      }
      goto start;
    }
  }

  return ret;

#else
  int i;
  size_t bytes = 0;
  void *bufferp;

  for (i = 0; i < iovcnt; ++i) {
    bytes += iov[i].iov_len;
  }

  if (self->buffer_length < bytes) {
    self->buffer = realloc(self->buffer, bytes);
    if (NULL == self->buffer) {
      self->buffer_length = 0;
      self->internal_error = 0;
      ret = AMQP_STATUS_NO_MEMORY;
      goto exit;
    }
    self->buffer_length = bytes;
  }

  bufferp = self->buffer;
  for (i = 0; i < iovcnt; ++i) {
    memcpy(bufferp, iov[i].iov_base, iov[i].iov_len);
    bufferp += iov[i].iov_len;
  }

  ret = amqp_tcp_socket_send_inner(self, self->buffer, bytes, 0);

exit:
  return ret;
#endif
}